

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache.cc
# Opt level: O3

int __thiscall
ctemplate::TemplateCache::Refcount(TemplateCache *this,TemplateCacheKey template_cache_key)

{
  int iVar1;
  iterator iVar2;
  ReaderMutexLock ml;
  ReaderMutexLock local_30;
  key_type local_28;
  
  local_30.mu_ = this->mutex_;
  if (((pthread_rwlock_t *)((long)local_30.mu_ + 0x38))->__size[0] == '\x01') {
    iVar1 = pthread_rwlock_rdlock((pthread_rwlock_t *)local_30.mu_);
    if (iVar1 != 0) {
      abort();
    }
  }
  local_28.first = template_cache_key.first;
  local_28.second = template_cache_key.second;
  iVar2 = std::
          _Hashtable<std::pair<unsigned_long,_int>,_std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>,_std::allocator<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_long,_int>_>,_ctemplate::TemplateCache::TemplateCacheHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&this->parsed_template_cache_->_M_h,&local_28);
  if (iVar2.
      super__Node_iterator_base<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>,_true>
      ._M_cur == (__node_type *)0x0) {
    iVar1 = 0;
  }
  else {
    iVar1 = RefcountedTemplate::refcount
                      (*(RefcountedTemplate **)
                        ((long)iVar2.
                               super__Node_iterator_base<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>,_true>
                               ._M_cur + 0x18));
  }
  ReaderMutexLock::~ReaderMutexLock(&local_30);
  return iVar1;
}

Assistant:

int TemplateCache::Refcount(const TemplateCacheKey template_cache_key) const {
  ReaderMutexLock ml(mutex_);
  CachedTemplate* it = find_ptr(*parsed_template_cache_, template_cache_key);
  return it ? it->refcounted_tpl->refcount() : 0;
}